

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

void hash_table_empty(hash_table_t *h)

{
  void **ppvVar1;
  hash_entry_s *phVar2;
  hash_entry_t *phVar3;
  hash_entry_s *ptr;
  long lVar4;
  
  if (0 < h->size) {
    lVar4 = 0;
    do {
      ptr = h->table[lVar4].next;
      while (ptr != (hash_entry_s *)0x0) {
        phVar2 = ptr->next;
        ckd_free(ptr);
        ptr = phVar2;
      }
      phVar3 = h->table;
      ppvVar1 = &phVar3[lVar4].val;
      *ppvVar1 = (void *)0x0;
      ppvVar1[1] = (hash_entry_s *)0x0;
      phVar3 = phVar3 + lVar4;
      phVar3->key = (char *)0x0;
      phVar3->len = 0;
      lVar4 = lVar4 + 1;
    } while (lVar4 < h->size);
  }
  h->inuse = 0;
  return;
}

Assistant:

void
hash_table_empty(hash_table_t *h)
{
    hash_entry_t *e, *e2;
    int32 i;

    for (i = 0; i < h->size; i++) {
        /* Free collision lists. */
        for (e = h->table[i].next; e; e = e2) {
            e2 = e->next;
            ckd_free((void *) e);
        }
        memset(&h->table[i], 0, sizeof(h->table[i]));
    }
    h->inuse = 0;
}